

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_confirmation_hash(uint8_t *out,uint16_t *plaintext,uint16_t *pubkey,uint p,uint q)

{
  ssh_hash *psVar1;
  ssh_hash *psVar2;
  uint8_t hashdata [64];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  
  psVar1 = sha512_select(&ssh_sha512);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
  }
  BinarySink_put_byte(psVar1->binarysink_,'\x02');
  psVar2 = sha512_select(&ssh_sha512);
  if (psVar2 != (ssh_hash *)0x0) {
    (*psVar2->vt->reset)(psVar2);
  }
  BinarySink_put_byte(psVar2->binarysink_,'\x03');
  ntru_encode_plaintext(plaintext,p,psVar2->binarysink_);
  (*psVar2->vt->digest)(psVar2,(uchar *)&local_78);
  (*psVar2->vt->free)(psVar2);
  BinarySink_put_data(psVar1->binarysink_,&local_78,0x20);
  psVar2 = sha512_select(&ssh_sha512);
  if (psVar2 != (ssh_hash *)0x0) {
    (*psVar2->vt->reset)(psVar2);
  }
  BinarySink_put_byte(psVar2->binarysink_,'\x04');
  ntru_encode_pubkey(pubkey,p,q,psVar2->binarysink_);
  (*psVar2->vt->digest)(psVar2,(uchar *)&local_78);
  (*psVar2->vt->free)(psVar2);
  BinarySink_put_data(psVar1->binarysink_,&local_78,0x20);
  (*psVar1->vt->digest)(psVar1,(uchar *)&local_78);
  (*psVar1->vt->free)(psVar1);
  *(undefined8 *)(out + 0x10) = local_68;
  *(undefined8 *)(out + 0x18) = uStack_60;
  *(undefined8 *)out = local_78;
  *(undefined8 *)(out + 8) = uStack_70;
  smemclr(&local_78,0x40);
  return;
}

Assistant:

void ntru_confirmation_hash(uint8_t *out, const uint16_t *plaintext,
                            const uint16_t *pubkey, unsigned p, unsigned q)
{
    /* The outer hash object */
    ssh_hash *hconfirm = ssh_hash_new(&ssh_sha512);
    put_byte(hconfirm, 2);             /* initial byte 2 */

    uint8_t hashdata[64];

    /* Compute H(3 || r) and add it to the main hash */
    ssh_hash *h3r = ssh_hash_new(&ssh_sha512);
    put_byte(h3r, 3);
    ntru_encode_plaintext(plaintext, p, BinarySink_UPCAST(h3r));
    ssh_hash_final(h3r, hashdata);
    put_data(hconfirm, hashdata, 32);

    /* Compute H(4 || K) and add it to the main hash */
    ssh_hash *h4K = ssh_hash_new(&ssh_sha512);
    put_byte(h4K, 4);
    ntru_encode_pubkey(pubkey, p, q, BinarySink_UPCAST(h4K));
    ssh_hash_final(h4K, hashdata);
    put_data(hconfirm, hashdata, 32);

    /* Compute the full output of the main SHA-512 hash */
    ssh_hash_final(hconfirm, hashdata);

    /* And copy the first 32 bytes into the caller's output array */
    memcpy(out, hashdata, 32);
    smemclr(hashdata, sizeof(hashdata));
}